

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Type_get_envelope
              (MPIABI_Datatype datatype,int *num_integers,int *num_addresses,int *num_datatypes,
              int *combiner)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  WPI_Handle<ompi_datatype_t_*> local_38;
  int *local_30;
  int *combiner_local;
  int *num_datatypes_local;
  int *num_addresses_local;
  int *num_integers_local;
  MPIABI_Datatype datatype_local;
  
  local_30 = combiner;
  combiner_local = num_datatypes;
  num_datatypes_local = num_addresses;
  num_addresses_local = num_integers;
  num_integers_local = (int *)datatype;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_38,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_38);
  iVar1 = MPI_Type_get_envelope
                    (poVar2,num_addresses_local,num_datatypes_local,combiner_local,local_30);
  return iVar1;
}

Assistant:

int MPIABI_Type_get_envelope(
  MPIABI_Datatype datatype,
  int * num_integers,
  int * num_addresses,
  int * num_datatypes,
  int * combiner
) {
  return MPI_Type_get_envelope(
    (MPI_Datatype)(WPI_Datatype)datatype,
    num_integers,
    num_addresses,
    num_datatypes,
    combiner
  );
}